

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  uint uVar2;
  char *__file;
  long lVar3;
  ostream *this;
  int local_1a0;
  RecordCallback local_180;
  function<bool_(const_csv::field_&)> local_160;
  undefined1 local_140 [8];
  anon_class_32_4_a02ad2fe recordAdder;
  size_t limit;
  int local_110;
  undefined4 uStack_10c;
  bool verbose;
  int total;
  int pp;
  FileDataSource input;
  undefined1 local_88 [8];
  Arguments args;
  char **argv_local;
  int argc_local;
  
  args.limit = (size_t)argv;
  Arguments::Arguments((Arguments *)local_88);
  bVar1 = handle_command_args(argc,(char **)args.limit,(Arguments *)local_88);
  if (bVar1) {
    csv::icu::FileDataSource::FileDataSource((FileDataSource *)&total);
    __file = (char *)std::__cxx11::string::c_str();
    lVar3 = std::__cxx11::string::length();
    if (lVar3 == 0) {
      local_1a0 = 0;
    }
    else {
      local_1a0 = std::__cxx11::string::c_str();
    }
    uVar2 = csv::icu::FileDataSource::open((FileDataSource *)&total,__file,local_1a0);
    if ((uVar2 & 1) == 0) {
      this = std::operator<<((ostream *)&std::cerr,"Unable to open file");
      std::ostream::operator<<((ostream *)this,std::endl<char,std::char_traits<char>>);
      exit(-1);
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_88,"tsv");
    if (bVar1) {
      input.super_DataSource.super_IDataSource._vptr_IDataSource._4_4_ = 9;
    }
    if (args._24_1_ != ',') {
      input.super_DataSource.super_IDataSource._vptr_IDataSource._4_4_ = (int)(char)args._24_1_;
    }
    uStack_10c = 0xffffffff;
    local_110 = 0;
    recordAdder.pp._0_1_ = args._25_1_ & 1;
    recordAdder.total = (int *)args._96_8_;
    local_140 = (undefined1  [8])&stack0xfffffffffffffef4;
    recordAdder.verbose = (bool)args._96_1_;
    recordAdder._9_7_ = args._97_7_;
    recordAdder.limit = (size_t)&local_110;
    std::function<bool_(const_csv::field_&)>::function(&local_160,(nullptr_t)0x0);
    std::function<bool(csv::record_const&,double)>::function<main::__0&,void>
              ((function<bool(csv::record_const&,double)> *)&local_180,
               (anon_class_32_4_a02ad2fe *)local_140);
    csv::parse((IDataSource *)&total,&local_160,&local_180);
    std::function<bool_(const_csv::record_&,_double)>::~function(&local_180);
    std::function<bool_(const_csv::field_&)>::~function(&local_160);
    if ((args._25_1_ & 1) != 0) {
      anon_unknown.dwarf_181e::PrintProgress(1.0,(long)local_110);
      std::ostream::operator<<((ostream *)&std::cerr,std::endl<char,std::char_traits<char>>);
    }
    argv_local._4_4_ = 0;
    input._length._0_4_ = 1;
    csv::icu::FileDataSource::~FileDataSource((FileDataSource *)&total);
  }
  else {
    argv_local._4_4_ = -1;
    input._length._0_4_ = 1;
  }
  Arguments::~Arguments((Arguments *)local_88);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, const char * argv[]) {

	// Wrap everything in a try block.  Do this every time,
	// because exceptions will be thrown for problems.
	Arguments args;
	if (handle_command_args(argc, argv, args) == false) {
		return -1;
	}

	csv::icu::FileDataSource input;
	if (!input.open(args.inputFile.c_str(), args.codepage.length() > 0 ? args.codepage.c_str() : NULL)) {
		cerr << "Unable to open file" << endl;
		exit(-1);
	}

	if (args.type == "tsv") {
		input.separator = '\t';
	}

	if (args.separator != ',') {
		input.separator = args.separator;
	}

	int pp = -1;
	int total = 0;

	bool verbose = args.verbose;
	size_t limit = args.limit;

	auto recordAdder = [&pp, verbose, limit, &total](const csv::record& record, double complete) -> bool {

		if (total > 0) {
			cout << "\n";
		}

		total += 1;
		if (verbose && (int)(complete*100) != pp) {
			pp = (int)(complete*100);
			PrintProgress(complete, record.row);
		}

		bool lineStarted = false;
		for (const auto& field : record.content) {
			if (lineStarted) {
				lineStarted = true;
				cout << "\t";
			}
			std::string fieldValue = field.content;
			ReplaceStringInPlace(fieldValue, "\"", "\"\"");
			cout << "\"" << fieldValue << "\"\t";
		}

		if (limit > 0 && record.row == limit - 1) {
			PrintProgress(1.0, record.row + 1);
			return false;
		}

		// Only flush every 1000 records
		if ((total % 10000) == 0) {
			cout << flush;
		}

		return true;
	};
	csv::parse(input, NULL, recordAdder);

	if (args.verbose) {
		PrintProgress(1, total);
		cerr << endl;
	}

	return 0;
}